

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::anon_unknown_0::CWriter::DefineLocalScopeName
          (string *__return_storage_ptr__,CWriter *this,string *name)

{
  size_type extraout_RDX;
  string_view name_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string_view local_48;
  string_view local_38;
  undefined1 local_21;
  string *local_20;
  string *name_local;
  CWriter *this_local;
  string *unique;
  
  local_21 = 0;
  local_20 = name;
  name_local = (string *)this;
  this_local = (CWriter *)__return_storage_ptr__;
  string_view::string_view(&local_48,name);
  name_00.size_ = extraout_RDX;
  name_00.data_ = (char *)local_48.size_;
  local_38 = StripLeadingDollar((anon_unknown_0 *)local_48.data_,name_00);
  DefineName(__return_storage_ptr__,this,&this->local_syms_,local_38);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_88,local_20,__return_storage_ptr__);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::insert(&this->local_sym_map_,&local_88);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::DefineLocalScopeName(const std::string& name) {
  std::string unique = DefineName(&local_syms_, StripLeadingDollar(name));
  local_sym_map_.insert(SymbolMap::value_type(name, unique));
  return unique;
}